

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int toLocaltime(DateTime *p,sqlite3_context *pCtx)

{
  int iVar1;
  sqlite3_mutex *psVar2;
  tm *ptVar3;
  ulong uVar4;
  int iVar5;
  time_t t;
  tm sLocal;
  DateTime x;
  long local_b0;
  tm local_a8;
  DateTime local_68;
  
  local_a8.tm_isdst = 0;
  local_a8._36_4_ = 0;
  local_a8.tm_gmtoff = 0;
  local_a8.tm_mon = 0;
  local_a8.tm_year = 0;
  local_a8.tm_wday = 0;
  local_a8.tm_yday = 0;
  local_a8.tm_sec = 0;
  local_a8.tm_min = 0;
  local_a8.tm_hour = 0;
  local_a8.tm_mday = 0;
  local_a8.tm_zone = (char *)0x0;
  computeJD(p);
  if (p->iJD - 0xc1bc387b0a01U < 0xfffffe0c05d817ff) {
    local_68.iJD = p->iJD;
    local_68.Y = p->Y;
    local_68.M = p->M;
    local_68.D = p->D;
    local_68.h = p->h;
    local_68.m = p->m;
    local_68.tz = p->tz;
    local_68.s = p->s;
    local_68.validJD = p->validJD;
    local_68.rawS = p->rawS;
    local_68.validYMD = p->validYMD;
    local_68.validHMS = p->validHMS;
    local_68.validTZ = p->validTZ;
    local_68.tzSet = p->tzSet;
    local_68.isError = p->isError;
    local_68._47_1_ = p->field_0x2f;
    computeYMD(&local_68);
    computeHMS(&local_68);
    iVar1 = local_68.Y % 4 + 2000;
    iVar5 = local_68.Y - iVar1;
    local_68.Y = iVar1;
    local_68._40_8_ = local_68._40_8_ & 0xffffffffffffff00;
    computeJD(&local_68);
    uVar4 = local_68.iJD / 1000;
    iVar5 = iVar5 + 0x76c;
  }
  else {
    uVar4 = (ulong)p->iJD / 1000;
    iVar5 = 0x76c;
  }
  local_b0 = uVar4 - 0x3118a36940;
  if (sqlite3Config.bCoreMutex == '\0') {
    psVar2 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar2);
  }
  ptVar3 = localtime(&local_b0);
  if (sqlite3Config.bLocaltimeFault != 0) {
    if (sqlite3Config.xAltLocaltime != (_func_int_void_ptr_void_ptr *)0x0) {
      ptVar3 = &local_a8;
      iVar1 = (*sqlite3Config.xAltLocaltime)(&local_b0,ptVar3);
      if (iVar1 == 0) goto LAB_001bcf79;
    }
    ptVar3 = (tm *)0x0;
  }
LAB_001bcf79:
  if (ptVar3 != (tm *)0x0) {
    local_a8.tm_zone = ptVar3->tm_zone;
    local_a8.tm_sec = ptVar3->tm_sec;
    local_a8.tm_min = ptVar3->tm_min;
    local_a8.tm_hour = ptVar3->tm_hour;
    local_a8.tm_mday = ptVar3->tm_mday;
    local_a8.tm_mon = ptVar3->tm_mon;
    local_a8.tm_year = ptVar3->tm_year;
    local_a8.tm_wday = ptVar3->tm_wday;
    local_a8.tm_yday = ptVar3->tm_yday;
    local_a8.tm_isdst = ptVar3->tm_isdst;
    local_a8._36_4_ = *(undefined4 *)&ptVar3->field_0x24;
    local_a8.tm_gmtoff = ptVar3->tm_gmtoff;
  }
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  if (ptVar3 == (tm *)0x0) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"local time unavailable",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    p->Y = iVar5 + local_a8.tm_year;
    p->M = local_a8.tm_mon + 1;
    p->D = local_a8.tm_mday;
    p->h = local_a8.tm_hour;
    p->m = local_a8.tm_min;
    p->s = (double)(p->iJD % 1000) * 0.001 + (double)local_a8.tm_sec;
    p->validJD = '\0';
    p->rawS = '\0';
    p->validYMD = '\x01';
    p->validHMS = '\x01';
    p->validTZ = '\0';
    p->isError = '\0';
  }
  return (uint)(ptVar3 == (tm *)0x0);
}

Assistant:

static int toLocaltime(
  DateTime *p,                   /* Date at which to calculate offset */
  sqlite3_context *pCtx          /* Write error here if one occurs */
){
  time_t t;
  struct tm sLocal;
  int iYearDiff;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  computeJD(p);
  if( p->iJD<2108667600*(i64)100000 /* 1970-01-01 */
   || p->iJD>2130141456*(i64)100000 /* 2038-01-18 */
  ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    DateTime x = *p;
    computeYMD_HMS(&x);
    iYearDiff = (2000 + x.Y%4) - x.Y;
    x.Y += iYearDiff;
    x.validJD = 0;
    computeJD(&x);
    t = (time_t)(x.iJD/1000 -  21086676*(i64)10000);
  }else{
    iYearDiff = 0;
    t = (time_t)(p->iJD/1000 -  21086676*(i64)10000);
  }
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    return SQLITE_ERROR;
  }
  p->Y = sLocal.tm_year + 1900 - iYearDiff;
  p->M = sLocal.tm_mon + 1;
  p->D = sLocal.tm_mday;
  p->h = sLocal.tm_hour;
  p->m = sLocal.tm_min;
  p->s = sLocal.tm_sec + (p->iJD%1000)*0.001;
  p->validYMD = 1;
  p->validHMS = 1;
  p->validJD = 0;
  p->rawS = 0;
  p->validTZ = 0;
  p->isError = 0;
  return SQLITE_OK;
}